

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O0

void __thiscall
AssertionTest_assertLeHandlerShouldBeCalled_Test::TestBody
          (AssertionTest_assertLeHandlerShouldBeCalled_Test *this)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  AssertionMessage *pAVar4;
  AssertionMessage *pAVar5;
  AssertionMessage *in_stack_fffffffffffffc58;
  AssertHelper local_310;
  Message local_308;
  int local_2fc;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_1;
  AssertionMessage local_2e0;
  AssertionMessage local_2d8;
  string local_2d0;
  AssertionFailure local_2b0;
  string local_270 [32];
  stringstream local_250 [8];
  stringstream expectedMsg;
  ostream local_240 [376];
  AssertHelper local_c8;
  Message local_c0;
  int local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  AssertionMessage local_98 [3];
  AssertionMessage local_80;
  string local_78;
  AssertionFailure local_58;
  int local_18;
  int local_14;
  int32_t b;
  int32_t a;
  AssertionTest_assertLeHandlerShouldBeCalled_Test *this_local;
  
  local_14 = 2;
  local_18 = 1;
  _b = this;
  cppassert::internal::AssertionMessage::AssertionMessage(&local_80);
  pAVar4 = cppassert::internal::AssertionMessage::operator<<(&local_80,&local_14);
  cppassert::internal::AssertionMessage::AssertionMessage(local_98);
  pAVar5 = cppassert::internal::AssertionMessage::operator<<(local_98,&local_18);
  cppassert::internal::getPredicateAssertionFailureMessage_abi_cxx11_
            (&local_78,(internal *)"<=","a","b",(char *)pAVar4,pAVar5,in_stack_fffffffffffffc58);
  cppassert::AssertionFailure::AssertionFailure
            (&local_58,0x9e,
             "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
             ,"virtual void AssertionTest_assertLeHandlerShouldBeCalled_Test::TestBody()",&local_78)
  ;
  cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&gtest_ar.message_);
  cppassert::AssertionFailure::onAssertionFailure(&local_58,(AssertionMessage *)&gtest_ar.message_);
  cppassert::internal::AssertionMessage::~AssertionMessage((AssertionMessage *)&gtest_ar.message_);
  cppassert::AssertionFailure::~AssertionFailure(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  cppassert::internal::AssertionMessage::~AssertionMessage(local_98);
  cppassert::internal::AssertionMessage::~AssertionMessage(&local_80);
  local_b4 = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_b0,"1","assertionHandlerCounter_",&local_b4,
             &(this->super_AssertionTest).assertionHandlerCounter_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,0x9f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::__cxx11::stringstream::stringstream(local_250);
  poVar3 = std::operator<<(local_240,"Expected message: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
  poVar3 = std::operator<<(poVar3," ");
  std::ostream::operator<<(poVar3,local_18);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_AssertionTest).expectedStreamMessage_,local_270);
  std::__cxx11::string::~string(local_270);
  if (local_18 < local_14) {
    cppassert::internal::AssertionMessage::AssertionMessage(&local_2d8);
    pAVar4 = cppassert::internal::AssertionMessage::operator<<(&local_2d8,&local_14);
    cppassert::internal::AssertionMessage::AssertionMessage(&local_2e0);
    pAVar5 = cppassert::internal::AssertionMessage::operator<<(&local_2e0,&local_18);
    cppassert::internal::getPredicateAssertionFailureMessage_abi_cxx11_
              (&local_2d0,(internal *)"<=","a","b",(char *)pAVar4,pAVar5,in_stack_fffffffffffffc58);
    cppassert::AssertionFailure::AssertionFailure
              (&local_2b0,0xa2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,"virtual void AssertionTest_assertLeHandlerShouldBeCalled_Test::TestBody()",
               &local_2d0);
    cppassert::internal::AssertionMessage::AssertionMessage
              ((AssertionMessage *)&gtest_ar_1.message_);
    pAVar4 = cppassert::internal::AssertionMessage::operator<<
                       ((AssertionMessage *)&gtest_ar_1.message_,(char (*) [19])"Expected message: "
                       );
    pAVar4 = cppassert::internal::AssertionMessage::operator<<(pAVar4,&local_14);
    pAVar4 = cppassert::internal::AssertionMessage::operator<<(pAVar4,(char (*) [2])0x1b15b1);
    pAVar4 = cppassert::internal::AssertionMessage::operator<<(pAVar4,&local_18);
    cppassert::AssertionFailure::onAssertionFailure(&local_2b0,pAVar4);
    cppassert::internal::AssertionMessage::~AssertionMessage
              ((AssertionMessage *)&gtest_ar_1.message_);
    cppassert::AssertionFailure::~AssertionFailure(&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    cppassert::internal::AssertionMessage::~AssertionMessage(&local_2e0);
    cppassert::internal::AssertionMessage::~AssertionMessage(&local_2d8);
  }
  local_2fc = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_2f8,"2","assertionHandlerCounter_",&local_2fc,
             &(this->super_AssertionTest).assertionHandlerCounter_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_308);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_310,&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  std::__cxx11::stringstream::~stringstream(local_250);
  return;
}

Assistant:

TEST_F(AssertionTest, assertLeHandlerShouldBeCalled)
{
    std::int32_t a = 2;
    std::int32_t b = 1;
    CPP_ASSERT_LE(a, b);
    EXPECT_EQ(1, assertionHandlerCounter_);

    SET_EXPECTED_MSG(a, b);
    CPP_ASSERT_LE(a, b, EXPECTED_TEST_MSG(a,b));
    EXPECT_EQ(2, assertionHandlerCounter_);
}